

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::removeGroup(FieldMap *this,int num,int tag)

{
  iterator this_00;
  int field;
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  reference ppFVar4;
  undefined1 local_b0 [8];
  IntField groupCount;
  const_iterator local_40;
  __normal_iterator<FIX::FieldMap_**,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_38;
  iterator group;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *groups;
  _Self local_20;
  iterator tagWithGroups;
  int tag_local;
  int num_local;
  FieldMap *this_local;
  
  tagWithGroups._M_node._0_4_ = tag;
  tagWithGroups._M_node._4_4_ = num;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::find(&this->m_groups,(key_type *)&tagWithGroups);
  groups = (vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)
           std::
           map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
           ::end(&this->m_groups);
  bVar1 = std::operator==(&local_20,(_Self *)&groups);
  if ((!bVar1) && (0 < (int)tagWithGroups._M_node._4_4_)) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
             ::operator->(&local_20);
    group._M_current = (FieldMap **)&ppVar2->second;
    sVar3 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size
                      ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)group._M_current
                      );
    if (tagWithGroups._M_node._4_4_ <= sVar3) {
      local_38._M_current =
           (FieldMap **)
           std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin(group._M_current);
      std::
      advance<__gnu_cxx::__normal_iterator<FIX::FieldMap**,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,int>
                (&local_38,tagWithGroups._M_node._4_4_ - 1);
      ppFVar4 = __gnu_cxx::
                __normal_iterator<FIX::FieldMap_**,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                ::operator*(&local_38);
      if (*ppFVar4 != (FieldMap *)0x0) {
        (*(*ppFVar4)->_vptr_FieldMap[1])();
      }
      this_00._M_current = group._M_current;
      __gnu_cxx::
      __normal_iterator<FIX::FieldMap*const*,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>
      ::__normal_iterator<FIX::FieldMap**>
                ((__normal_iterator<FIX::FieldMap*const*,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>
                  *)&local_40,&local_38);
      std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::erase
                ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)this_00._M_current,
                 local_40);
      sVar3 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size
                        ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)
                         group._M_current);
      field = (int)tagWithGroups._M_node;
      if (sVar3 == 0) {
        groupCount.super_FieldBase.m_metrics =
             (field_metrics)
             std::
             map<int,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
             ::erase_abi_cxx11_((map<int,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
                                 *)&this->m_groups,(iterator)local_20._M_node);
        removeField(this,(int)tagWithGroups._M_node);
      }
      else {
        sVar3 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size
                          ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)
                           group._M_current);
        IntField::IntField((IntField *)local_b0,field,(int)sVar3);
        setField(this,(FieldBase *)local_b0,true);
        IntField::~IntField((IntField *)local_b0);
      }
    }
  }
  return;
}

Assistant:

void FieldMap::removeGroup(int num, int tag) {
  Groups::iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }
  if (num <= 0) {
    return;
  }
  std::vector<FieldMap *> &groups = tagWithGroups->second;
  if (groups.size() < static_cast<unsigned>(num)) {
    return;
  }

  std::vector<FieldMap *>::iterator group = groups.begin();
  std::advance(group, (num - 1));

  delete (*group);
  groups.erase(group);

  if (groups.size() == 0) {
    m_groups.erase(tagWithGroups);
    removeField(tag);
  } else {
    IntField groupCount(tag, (int)groups.size());
    setField(groupCount);
  }
}